

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O2

void __thiscall libsgp4::SGP4::Initialise(SGP4 *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  double __x;
  SatelliteException *this_00;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_b0;
  undefined8 local_a8;
  DateTime local_18;
  
  *(undefined2 *)(this + 0x2c8) = 0;
  memset(this,0,0x268);
  if ((*(double *)(this + 0x280) < 0.0) || (0.999 < *(double *)(this + 0x280))) {
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Eccentricity out of range");
  }
  else {
    dVar12 = *(double *)(this + 0x288);
    if ((0.0 <= dVar12) && (dVar12 <= 3.141592653589793)) {
      RecomputeConstants(dVar12,(double *)(this + 8),(double *)this,(double *)(this + 0x28),
                         (double *)(this + 0x20),(double *)(this + 0x30),(double *)(this + 0x40),
                         (double *)(this + 0x38));
      dVar12 = *(double *)this;
      dVar14 = *(double *)(this + 0x280) * *(double *)(this + 0x280);
      dVar4 = 1.0 - dVar14;
      if (dVar4 < 0.0) {
        dVar5 = sqrt(dVar4);
      }
      else {
        dVar5 = SQRT(dVar4);
      }
      if (225.0 <= *(double *)(this + 0x2b8)) {
        this[0x2c9] = (SGP4)0x1;
        uVar10 = (undefined4)*(undefined8 *)(this + 0x2b0);
        uVar11 = (undefined4)((ulong)*(undefined8 *)(this + 0x2b0) >> 0x20);
      }
      else {
        *(undefined2 *)(this + 0x2c8) = 0;
        dVar9 = *(double *)(this + 0x2b0);
        uVar10 = SUB84(dVar9,0);
        uVar11 = (undefined4)((ulong)dVar9 >> 0x20);
        if (dVar9 < 220.0) {
          this[0x2c8] = (SGP4)0x1;
        }
      }
      dVar12 = dVar12 * dVar12;
      if (156.0 < (double)CONCAT44(uVar11,uVar10) || (double)CONCAT44(uVar11,uVar10) == 156.0) {
        local_b0 = kQOMS2T;
        dVar9 = 1.0122292801892716;
      }
      else {
        uVar3 = -(ulong)((double)CONCAT44(uVar11,uVar10) < 98.0);
        local_a8._4_4_ = (uint)(uVar3 >> 0x20);
        local_a8 = (double)(~uVar3 & (ulong)((double)CONCAT44(uVar11,uVar10) + -78.0) |
                           (ulong)(local_a8._4_4_ & 0x40340000) << 0x20);
        local_b0 = pow((120.0 - local_a8) / 6378.135,4.0);
        dVar9 = local_a8 / 6378.135 + 1.0;
      }
      dVar17 = *(double *)(this + 0x2a0);
      dVar15 = 1.0 / (dVar17 * dVar17 * dVar4 * dVar4);
      __x = 1.0 / (dVar17 - dVar9);
      dVar18 = dVar17 * *(double *)(this + 0x280) * __x;
      *(double *)(this + 0x10) = dVar18;
      dVar20 = *(double *)(this + 0x280) * dVar18;
      dVar18 = dVar18 * dVar18;
      dVar22 = ABS(1.0 - dVar18);
      dVar6 = pow(__x,4.0);
      dVar6 = dVar6 * local_b0;
      dVar7 = pow(dVar22,3.5);
      dVar7 = dVar6 / dVar7;
      dVar17 = *(double *)(this + 0x2a8);
      dVar19 = *(double *)(this + 0x2a0);
      dVar1 = *(double *)(this + 0x20);
      dVar13 = *(double *)(this + 0x28);
      *(double *)(this + 0x50) =
           (((dVar18 + 4.0) * dVar20 + dVar18 * 1.5 + 1.0) * dVar19 +
           ((dVar18 + 8.0) * dVar18 * 3.0 + 8.0) *
           ((__x * 0.00040598100000000003) / dVar22) * dVar13) * dVar7 * dVar17 *
           *(double *)(this + 0x298);
      dVar16 = *(double *)(this + 0x280);
      dVar21 = *(double *)(this + 0x10);
      dVar8 = cos(*(double *)(this + 0x278) + *(double *)(this + 0x278));
      *(double *)(this + 0x58) =
           (((__x * -0.001082616) / (dVar22 * dVar19)) *
            (dVar8 * ((dVar18 + dVar18) - (dVar18 + 1.0) * dVar20) * dVar1 * 0.75 +
            ((dVar20 * -0.5 + 1.5) * dVar18 + (1.0 - (dVar20 + dVar20))) * dVar13 * -3.0) +
           (dVar18 * 0.5 + 2.0) * dVar21 + (dVar18 + dVar18 + 0.5) * dVar16) *
           (dVar17 + dVar17) * dVar7 * dVar19 * dVar4;
      dVar17 = *(double *)(this + 0x2a8);
      dVar19 = dVar15 * 0.0016239240000000001 * dVar17;
      dVar21 = dVar19 * 0.000541308 * dVar15;
      dVar13 = dVar15 * 7.762359374999998e-07 * dVar15 * dVar17;
      dVar16 = dVar21 * 0.0625;
      dVar22 = dVar12 * dVar12;
      *(double *)(this + 0x70) =
           (dVar22 * 137.0 + dVar12 * -78.0 + 13.0) * dVar5 * dVar16 +
           dVar19 * 0.5 * dVar5 * *(double *)(this + 0x28) + dVar17;
      dVar1 = -dVar19 * *(double *)this;
      *(double *)(this + 0x60) =
           (dVar22 * 395.0 + dVar12 * -114.0 + 7.0) * dVar16 + dVar19 * -0.5 * (dVar12 * -5.0 + 1.0)
           + dVar13 * (dVar22 * 49.0 + dVar12 * -36.0 + 3.0);
      *(double *)(this + 0x68) =
           dVar1 + *(double *)this *
                   ((dVar12 * -19.0 + 4.0) * dVar21 * 0.5 +
                   (dVar12 * -7.0 + 3.0) * (dVar13 + dVar13));
      *(double *)(this + 0x48) = dVar4 * 3.5 * dVar1 * *(double *)(this + 0x50);
      *(double *)(this + 0x18) = *(double *)(this + 0x50) * 1.5;
      if (this[0x2c9] == (SGP4)0x1) {
        local_18.m_encoded = *(int64_t *)(this + 0x2c0);
        dVar9 = DateTime::ToGreenwichSiderealTime(&local_18);
        *(double *)(this + 0xd0) = dVar9;
        DeepSpaceInitialise(this,dVar14,*(double *)(this + 8),*(double *)this,dVar5,dVar12,dVar4,
                            *(double *)(this + 0x70),*(double *)(this + 0x60),
                            *(double *)(this + 0x68));
      }
      else {
        dVar12 = 0.0;
        if (0.0001 < *(double *)(this + 0x280)) {
          dVar12 = (__x * dVar6 * 0.004690139440023056 * dVar17 * *(double *)(this + 8)) /
                   *(double *)(this + 0x280);
        }
        *(double *)(this + 0x78) =
             ((dVar18 + dVar20) * 2.75 + 1.0 + dVar20 * dVar18) *
             dVar4 * (dVar7 + dVar7) * *(double *)(this + 0x2a0);
        dVar4 = *(double *)(this + 0x298);
        dVar14 = cos(*(double *)(this + 0x278));
        *(double *)(this + 0x80) = dVar14 * dVar12 * dVar4;
        *(undefined8 *)(this + 0x88) = 0;
        if (0.0001 < *(double *)(this + 0x280)) {
          *(double *)(this + 0x88) =
               (dVar6 * -0.6666666666666666 * *(double *)(this + 0x298)) / dVar20;
        }
        dVar12 = *(double *)(this + 0x10);
        dVar4 = cos(*(double *)(this + 0x268));
        dVar12 = pow(dVar4 * dVar12 + 1.0,3.0);
        *(double *)(this + 0x90) = dVar12;
        dVar12 = sin(*(double *)(this + 0x268));
        *(double *)(this + 0x98) = dVar12;
        if (this[0x2c8] == (SGP4)0x0) {
          dVar12 = *(double *)(this + 0x50);
          dVar19 = dVar12 * dVar12;
          dVar4 = *(double *)(this + 0x2a0);
          dVar5 = dVar4 * 4.0 * __x * dVar19;
          *(double *)(this + 0xa0) = dVar5;
          dVar17 = (__x * dVar5 * dVar12) / 3.0;
          dVar14 = (dVar4 * 221.0 + dVar9 * 31.0) * dVar17 * 0.5 * dVar4 * __x * dVar12;
          *(double *)(this + 0xb0) = dVar14;
          *(double *)(this + 0xb8) = dVar19 + dVar19 + dVar5;
          dVar17 = dVar17 * (dVar4 * 17.0 + dVar9);
          *(double *)(this + 0xa8) = dVar17;
          dVar4 = ((dVar5 + dVar5 + dVar19) * dVar19 * 15.0 +
                  dVar14 * 3.0 + dVar12 * 12.0 * dVar17 + dVar5 * 6.0 * dVar5) * 0.2;
          auVar2._8_4_ = SUB84(dVar4,0);
          auVar2._0_8_ = (dVar17 * 3.0 + (dVar5 * 12.0 + dVar19 * 10.0) * dVar12) * 0.25;
          auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
          *(undefined1 (*) [16])(this + 0xc0) = auVar2;
        }
      }
      return;
    }
    this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
    SatelliteException::SatelliteException(this_00,"Inclination out of range");
  }
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SGP4::Initialise()
{
    /*
     * reset all constants etc
     */
    Reset();

    /*
     * error checks
     */
    if (elements_.Eccentricity() < 0.0 || elements_.Eccentricity() > 0.999)
    {
        throw SatelliteException("Eccentricity out of range");
    }

    if (elements_.Inclination() < 0.0 || elements_.Inclination() > kPI)
    {
        throw SatelliteException("Inclination out of range");
    }

    RecomputeConstants(elements_.Inclination(),
                       common_consts_.sinio,
                       common_consts_.cosio,
                       common_consts_.x3thm1,
                       common_consts_.x1mth2,
                       common_consts_.x7thm1,
                       common_consts_.xlcof,
                       common_consts_.aycof);

    const double theta2 = common_consts_.cosio * common_consts_.cosio;
    const double eosq = elements_.Eccentricity() * elements_.Eccentricity();
    const double betao2 = 1.0 - eosq;
    const double betao = sqrt(betao2);

    if (elements_.Period() >= 225.0)
    {
        use_deep_space_ = true;
    }
    else
    {
        use_deep_space_ = false;
        use_simple_model_ = false;
        /*
         * for perigee less than 220 kilometers, the simple_model flag is set
         * and the equations are truncated to linear variation in sqrt a and
         * quadratic variation in mean anomly. also, the c3 term, the
         * delta omega term and the delta m term are dropped
         */
        if (elements_.Perigee() < 220.0)
        {
            use_simple_model_ = true;
        }
    }

    /*
     * for perigee below 156km, the values of
     * s4 and qoms2t are altered
     */
    double s4 = kS;
    double qoms24 = kQOMS2T;
    if (elements_.Perigee() < 156.0)
    {
        s4 = elements_.Perigee() - 78.0;
        if (elements_.Perigee() < 98.0) 
        {
            s4 = 20.0;
        }
        qoms24 = pow((120.0 - s4) * kAE / kXKMPER, 4.0);
        s4 = s4 / kXKMPER + kAE;
    }

    /*
     * generate constants
     */
    const double pinvsq = 1.0
        / (elements_.RecoveredSemiMajorAxis()
                * elements_.RecoveredSemiMajorAxis()
                * betao2 * betao2);
    const double tsi = 1.0 / (elements_.RecoveredSemiMajorAxis() - s4);
    common_consts_.eta = elements_.RecoveredSemiMajorAxis()
        * elements_.Eccentricity() * tsi;
    const double etasq = common_consts_.eta * common_consts_.eta;
    const double eeta = elements_.Eccentricity() * common_consts_.eta;
    const double psisq = fabs(1.0 - etasq);
    const double coef = qoms24 * pow(tsi, 4.0);
    const double coef1 = coef / pow(psisq, 3.5);
    const double c2 = coef1 * elements_.RecoveredMeanMotion()
        * (elements_.RecoveredSemiMajorAxis()
        * (1.0 + 1.5 * etasq + eeta * (4.0 + etasq))
        + 0.75 * kCK2 * tsi / psisq * common_consts_.x3thm1
        * (8.0 + 3.0 * etasq * (8.0 + etasq)));
    common_consts_.c1 = elements_.BStar() * c2;
    common_consts_.c4 = 2.0 * elements_.RecoveredMeanMotion()
        * coef1 * elements_.RecoveredSemiMajorAxis() * betao2
        * (common_consts_.eta * (2.0 + 0.5 * etasq) + elements_.Eccentricity()
        * (0.5 + 2.0 * etasq)
        - 2.0 * kCK2 * tsi / (elements_.RecoveredSemiMajorAxis() * psisq)
        * (-3.0 * common_consts_.x3thm1 * (1.0 - 2.0 * eeta + etasq
        * (1.5 - 0.5 * eeta))
        + 0.75 * common_consts_.x1mth2 * (2.0 * etasq - eeta *
            (1.0 + etasq)) * cos(2.0 * elements_.ArgumentPerigee())));
    const double theta4 = theta2 * theta2;
    const double temp1 = 3.0 * kCK2 * pinvsq * elements_.RecoveredMeanMotion();
    const double temp2 = temp1 * kCK2 * pinvsq;
    const double temp3 = 1.25 * kCK4 * pinvsq * pinvsq * elements_.RecoveredMeanMotion();
    common_consts_.xmdot = elements_.RecoveredMeanMotion() + 0.5 * temp1 * betao *
            common_consts_.x3thm1 + 0.0625 * temp2 * betao *
            (13.0 - 78.0 * theta2 + 137.0 * theta4);
    const double x1m5th = 1.0 - 5.0 * theta2;
    common_consts_.omgdot = -0.5 * temp1 * x1m5th +
            0.0625 * temp2 * (7.0 - 114.0 * theta2 + 395.0 * theta4) +
            temp3 * (3.0 - 36.0 * theta2 + 49.0 * theta4);
    const double xhdot1 = -temp1 * common_consts_.cosio;
    common_consts_.xnodot = xhdot1 + (0.5 * temp2 * (4.0 - 19.0 * theta2) + 2.0 * temp3 *
            (3.0 - 7.0 * theta2)) * common_consts_.cosio;
    common_consts_.xnodcf = 3.5 * betao2 * xhdot1 * common_consts_.c1;
    common_consts_.t2cof = 1.5 * common_consts_.c1;

    if (use_deep_space_)
    {
        deepspace_consts_.gsto = elements_.Epoch().ToGreenwichSiderealTime();

        DeepSpaceInitialise(eosq,
                            common_consts_.sinio,
                            common_consts_.cosio,
                            betao,
                            theta2,
                            betao2,
                            common_consts_.xmdot,
                            common_consts_.omgdot,
                            common_consts_.xnodot);
    }
    else
    {
        double c3 = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            c3 = coef * tsi * kA3OVK2 * elements_.RecoveredMeanMotion() * kAE *
                    common_consts_.sinio / elements_.Eccentricity();
        }

        nearspace_consts_.c5 = 2.0 * coef1 * elements_.RecoveredSemiMajorAxis() * betao2 * (1.0 + 2.75 *
                (etasq + eeta) + eeta * etasq);
        nearspace_consts_.omgcof = elements_.BStar() * c3 * cos(elements_.ArgumentPerigee());

        nearspace_consts_.xmcof = 0.0;
        if (elements_.Eccentricity() > 1.0e-4)
        {
            nearspace_consts_.xmcof = -kTWOTHIRD * coef * elements_.BStar() * kAE / eeta;
        }

        nearspace_consts_.delmo = pow(1.0 + common_consts_.eta * (cos(elements_.MeanAnomoly())), 3.0);
        nearspace_consts_.sinmo = sin(elements_.MeanAnomoly());

        if (!use_simple_model_)
        {
            const double c1sq = common_consts_.c1 * common_consts_.c1;
            nearspace_consts_.d2 = 4.0 * elements_.RecoveredSemiMajorAxis() * tsi * c1sq;
            const double temp = nearspace_consts_.d2 * tsi * common_consts_.c1 / 3.0;
            nearspace_consts_.d3 = (17.0 * elements_.RecoveredSemiMajorAxis() + s4) * temp;
            nearspace_consts_.d4 = 0.5 * temp * elements_.RecoveredSemiMajorAxis() *
                    tsi * (221.0 * elements_.RecoveredSemiMajorAxis() + 31.0 * s4) * common_consts_.c1;
            nearspace_consts_.t3cof = nearspace_consts_.d2 + 2.0 * c1sq;
            nearspace_consts_.t4cof = 0.25 * (3.0 * nearspace_consts_.d3 + common_consts_.c1 *
                    (12.0 * nearspace_consts_.d2 + 10.0 * c1sq));
            nearspace_consts_.t5cof = 0.2 * (3.0 * nearspace_consts_.d4 + 12.0 * common_consts_.c1 *
                    nearspace_consts_.d3 + 6.0 * nearspace_consts_.d2 * nearspace_consts_.d2 + 15.0 *
                    c1sq * (2.0 * nearspace_consts_.d2 + c1sq));
        }
    }
}